

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O2

void lore_append_attack(textblock *tb,monster_race *race,monster_lore *lore,bitflag *known_flags)

{
  random_value *prVar1;
  blow_effect *pbVar2;
  monster_blow *pmVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  random_value v;
  blow_effect *pbVar7;
  player *p;
  _Bool _Var8;
  ushort uVar9;
  monster_sex_t mVar10;
  wchar_t wVar11;
  int iVar12;
  wchar_t wVar13;
  uint uVar14;
  angband_constants *paVar15;
  object *poVar16;
  int iVar17;
  ulong uVar18;
  char *pcVar19;
  random_chance *prVar20;
  long lVar21;
  undefined1 *puVar22;
  bitflag *pbVar23;
  char *fl;
  ulong uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  wchar_t i;
  uint8_t *puVar29;
  uint8_t *puVar30;
  bool bVar31;
  byte bVar32;
  player_state_conflict in_stack_fffffffffffffce8;
  random_chance c;
  
  bVar32 = 0;
  if (((tb == (textblock *)0x0) || (race == (monster_race *)0x0)) || (lore == (monster_lore *)0x0))
  {
    __assert_fail("tb && race && lore",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-lore.c"
                  ,0x667,
                  "void lore_append_attack(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
                 );
  }
  mVar10 = lore_monster_sex(race);
  _Var8 = flag_has_dbg(known_flags,0xc,0x1a,"known_flags","RF_NEVER_BLOW");
  uVar24 = (ulong)mVar10;
  if (_Var8) {
    textblock_append(tb,"%s has no physical attacks.  ",
                     *(undefined8 *)(lore_pronoun_nominative_lore_pronouns + uVar24 * 0x10 + 8));
    return;
  }
  uVar9 = z_info->mon_blows_max;
  lVar21 = 8;
  iVar25 = 0;
  iVar26 = 0;
  for (uVar18 = 0; uVar9 != uVar18; uVar18 = uVar18 + 1) {
    if (*(long *)((long)&race->blow->next + lVar21) != 0) {
      iVar25 = iVar25 + 1;
      iVar26 = iVar26 + (uint)lore->blow_known[uVar18];
    }
    lVar21 = lVar21 + 0x30;
  }
  if (iVar26 == 0) {
    textblock_append_c(tb,'\x03',"Nothing is known about %s attack.  ",
                       *(undefined8 *)(lore_pronoun_possessive_lore_pronouns + uVar24 * 0x10));
    return;
  }
  iVar27 = 99;
  uVar18 = 0;
  iVar17 = 0;
  do {
    if (uVar9 <= uVar18) {
      textblock_append(tb,", averaging");
      if (iVar26 < iVar25) {
        textblock_append_c(tb,'\x03'," at least");
      }
      textblock_append_c(tb,'\r'," %d",(long)iVar27 / 100 & 0xffffffff);
      textblock_append(tb," damage on each of %s turns.  ",
                       *(undefined8 *)(lore_pronoun_possessive_lore_pronouns + uVar24 * 0x10));
      return;
    }
    pmVar3 = race->blow;
    if ((pmVar3[uVar18].method != (blow_method_conflict *)0x0) && (lore->blow_known[uVar18] == true)
       ) {
      prVar1 = &pmVar3[uVar18].dice;
      uVar4._0_4_ = prVar1->base;
      uVar4._4_4_ = prVar1->dice;
      uVar5._0_4_ = pmVar3[uVar18].dice.sides;
      uVar5._4_4_ = pmVar3[uVar18].dice.m_bonus;
      v = *prVar1;
      pcVar6 = (pmVar3[uVar18].effect)->desc;
      if (iVar17 == 0) {
        textblock_append(tb,"%s can ",
                         *(undefined8 *)(lore_pronoun_nominative_lore_pronouns + uVar24 * 0x10 + 8))
        ;
      }
      else {
        if (iVar17 < iVar26 + -1) {
          pcVar19 = ", ";
        }
        else {
          pcVar19 = ", and ";
        }
        textblock_append(tb,pcVar19);
      }
      textblock_append(tb,"%s",(race->blow[uVar18].method)->desc);
      if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
        wVar11 = blow_index((race->blow[uVar18].effect)->name);
        textblock_append(tb," to ");
        p = player;
        pbVar2 = blow_effects + wVar11;
        puVar30 = &blow_effects[wVar11].lore_attr_resist;
        puVar29 = puVar30;
        if (*puVar30 == '\0') {
          if (blow_effects[wVar11].lore_attr_immune == '\0') goto LAB_0017427e;
LAB_001741d0:
          pbVar7 = blow_effects + wVar11;
          for (wVar11 = L'\0';
              (wVar11 != L'\x04' && (wVar13 = proj_name_to_idx(pbVar2->name), wVar11 != wVar13));
              wVar11 = wVar11 + L'\x01') {
          }
          memcpy(&c,&p->known_state,0x13c);
          prVar20 = &c;
          puVar22 = &stack0xfffffffffffffce8;
          for (lVar21 = 0x13c; lVar21 != 0; lVar21 = lVar21 + -1) {
            *puVar22 = (char)prVar20->numerator;
            prVar20 = (random_chance *)((long)prVar20 + (ulong)bVar32 * -2 + 1);
            puVar22 = puVar22 + (ulong)bVar32 * -2 + 1;
          }
          _Var8 = player_is_immune(in_stack_fffffffffffffce8,wVar11);
          puVar29 = &pbVar7->lore_attr_immune;
          if (!_Var8) {
            memcpy(&c,&p->known_state,0x13c);
            prVar20 = &c;
            puVar22 = &stack0xfffffffffffffce8;
            for (lVar21 = 0x13c; lVar21 != 0; lVar21 = lVar21 + -1) {
              *puVar22 = (char)prVar20->numerator;
              prVar20 = (random_chance *)((long)prVar20 + (ulong)bVar32 * -2 + 1);
              puVar22 = puVar22 + (ulong)bVar32 * -2 + 1;
            }
            _Var8 = player_resists_effects(in_stack_fffffffffffffce8,wVar11);
            puVar29 = &pbVar2->lore_attr;
            if (_Var8) {
              puVar29 = puVar30;
            }
          }
        }
        else {
          if (blow_effects[wVar11].lore_attr_immune != '\0') goto LAB_001741d0;
          pcVar19 = pbVar2->effect_type;
          iVar12 = strcmp(pcVar19,"theft");
          if (iVar12 == 0) {
            puVar29 = &pbVar2->lore_attr;
            if (99 < (int)p->lev + adj_dex_safe[(p->known_state).stat_ind[3]]) {
              puVar29 = puVar30;
            }
            goto LAB_0017436d;
          }
          iVar12 = strcmp(pcVar19,"drain");
          if (iVar12 == 0) {
            uVar28 = 0;
            paVar15 = z_info;
            while ((uVar9 = paVar15->pack_size, uVar28 < uVar9 &&
                   (((poVar16 = p->upkeep->inven[uVar28], poVar16 == (object *)0x0 ||
                     (_Var8 = tval_can_have_charges(poVar16), paVar15 = z_info, !_Var8)) ||
                    (poVar16->pval == 0))))) {
              uVar28 = uVar28 + 1;
            }
            bVar31 = uVar28 < uVar9;
LAB_00174369:
            if (bVar31) {
              puVar29 = &pbVar2->lore_attr;
            }
          }
          else {
            iVar12 = strcmp(pcVar19,"eat-food");
            if (iVar12 == 0) {
              uVar28 = 0;
              paVar15 = z_info;
              while ((uVar9 = paVar15->pack_size, uVar28 < uVar9 &&
                     ((poVar16 = p->upkeep->inven[uVar28], poVar16 == (object *)0x0 ||
                      (_Var8 = tval_is_edible(poVar16), paVar15 = z_info, !_Var8))))) {
                uVar28 = uVar28 + 1;
              }
              bVar31 = uVar28 < uVar9;
              goto LAB_00174369;
            }
            iVar12 = strcmp(pcVar19,"eat-light");
            if (iVar12 == 0) {
              wVar11 = slot_by_name(p,"light");
              poVar16 = slot_object(p,wVar11);
              if ((poVar16 != (object *)0x0) && (poVar16->timeout != 0)) {
                pbVar23 = poVar16->flags;
                wVar11 = L'\x19';
                pcVar19 = "obj->flags";
                fl = "OF_NO_FUEL";
LAB_00174601:
                _Var8 = flag_has_dbg(pbVar23,6,wVar11,pcVar19,fl);
                puVar29 = &pbVar2->lore_attr;
                if (_Var8) {
                  puVar29 = puVar30;
                }
              }
            }
            else {
              iVar12 = strcmp(pcVar19,"element");
              if (iVar12 == 0) {
                wVar11 = pbVar2->resist;
                memcpy(&c,&p->known_state,0x13c);
                prVar20 = &c;
                puVar22 = &stack0xfffffffffffffce8;
                for (lVar21 = 0x13c; lVar21 != 0; lVar21 = lVar21 + -1) {
                  *puVar22 = (char)prVar20->numerator;
                  prVar20 = (random_chance *)((long)prVar20 + (ulong)bVar32 * -2 + 1);
                  puVar22 = puVar22 + (ulong)bVar32 * -2 + 1;
                }
                _Var8 = player_resists_effects(in_stack_fffffffffffffce8,wVar11);
                puVar29 = &pbVar2->lore_attr;
                if (_Var8) {
                  puVar29 = puVar30;
                }
              }
              else {
                iVar12 = strcmp(pcVar19,"flag");
                if (iVar12 == 0) {
                  pbVar23 = (p->known_state).flags;
                  wVar11 = pbVar2->resist;
                  pcVar19 = "p->known_state.flags";
                  fl = "blow->resist";
                  goto LAB_00174601;
                }
                iVar12 = strcmp(pcVar19,"all_sustains");
                if (iVar12 == 0) {
                  pbVar23 = (p->known_state).flags;
                  _Var8 = flag_has_dbg(pbVar23,6,1,"p->known_state.flags","OF_SUST_STR");
                  if (((_Var8) &&
                      (_Var8 = flag_has_dbg(pbVar23,6,2,"p->known_state.flags","OF_SUST_INT"), _Var8
                      )) && ((_Var8 = flag_has_dbg(pbVar23,6,3,"p->known_state.flags","OF_SUST_WIS")
                             , _Var8 &&
                             ((_Var8 = flag_has_dbg(pbVar23,6,4,"p->known_state.flags","OF_SUST_DEX"
                                                   ), _Var8 &&
                              (_Var8 = flag_has_dbg(pbVar23,6,5,"p->known_state.flags","OF_SUST_CON"
                                                   ), _Var8)))))) goto LAB_0017436d;
                }
LAB_0017427e:
                puVar29 = &pbVar2->lore_attr;
              }
            }
          }
        }
LAB_0017436d:
        uVar28 = uVar4 >> 0x20;
        textblock_append_c(tb,*puVar29,"%s",pcVar6);
        textblock_append(tb," (");
        if ((undefined4)uVar4 == 0) {
          if (uVar5 >> 0x20 != 0 || (undefined4)uVar5 != 0 && uVar28 != 0) goto LAB_00174423;
        }
        else {
          textblock_append_c(tb,'\r',"%d",uVar4 & 0xffffffff);
LAB_00174423:
          if ((undefined4)uVar5 != 0 && uVar28 != 0) {
            textblock_append_c(tb,'\r',"%dd%d",uVar28,uVar5);
          }
          if (uVar5 >> 0x20 != 0) {
            textblock_append_c(tb,'\r',"M%d");
          }
          textblock_append(tb,", ");
        }
        wVar11 = chance_of_monster_hit_base(race,(blow_effect *)race->blow[uVar18].effect);
        hit_chance(&c,wVar11,(player->state).to_a + (player->state).ac);
        uVar14 = random_chance_scaled(c,100);
        textblock_append_c(tb,'\x0e',"%d",(ulong)uVar14);
        textblock_append(tb,"%%)");
        iVar12 = randcalc(v,0,AVERAGE);
        iVar27 = iVar27 + iVar12 * uVar14;
      }
      iVar17 = iVar17 + 1;
      uVar9 = z_info->mon_blows_max;
    }
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

void lore_append_attack(textblock *tb, const struct monster_race *race,
						const struct monster_lore *lore,
						bitflag known_flags[RF_SIZE])
{
	int i, known_attacks, total_attacks, described_count, total_centidamage;
	monster_sex_t msex = MON_SEX_NEUTER;

	assert(tb && race && lore);

	/* Extract a gender (if applicable) */
	msex = lore_monster_sex(race);

	/* Notice lack of attacks */
	if (rf_has(known_flags, RF_NEVER_BLOW)) {
		textblock_append(tb, "%s has no physical attacks.  ",
						 lore_pronoun_nominative(msex, true));
		return;
	}

	total_attacks = 0;
	known_attacks = 0;

	/* Count the number of defined and known attacks */
	for (i = 0; i < z_info->mon_blows_max; i++) {
		/* Skip non-attacks */
		if (!race->blow[i].method) continue;

		total_attacks++;
		if (lore->blow_known[i])
			known_attacks++;
	}

	/* Describe the lack of knowledge */
	if (known_attacks == 0) {
		textblock_append_c(tb, COLOUR_ORANGE, "Nothing is known about %s attack.  ",
						 lore_pronoun_possessive(msex, false));
		return;
	}

	described_count = 0;
	total_centidamage = 99; // round up the final result to the next higher point

	/* Describe each melee attack */
	for (i = 0; i < z_info->mon_blows_max; i++) {
		random_value dice;
		const char *effect_str = NULL;

		/* Skip unknown and undefined attacks */
		if (!race->blow[i].method || !lore->blow_known[i]) continue;

		/* Extract the attack info */
		dice = race->blow[i].dice;
		effect_str = race->blow[i].effect->desc;

		/* Introduce the attack description */
		if (described_count == 0)
			textblock_append(tb, "%s can ",
							 lore_pronoun_nominative(msex, true));
		else if (described_count < known_attacks - 1)
			textblock_append(tb, ", ");
		else
			textblock_append(tb, ", and ");

		/* Describe the method */
		textblock_append(tb, "%s", race->blow[i].method->desc);

		/* Describe the effect (if any) */
		if (effect_str && strlen(effect_str) > 0) {
			int index = blow_index(race->blow[i].effect->name);
			/* Describe the attack type */
			textblock_append(tb, " to ");
			textblock_append_c(tb, blow_color(player, index), "%s", effect_str);

			textblock_append(tb, " (");
			/* Describe damage (if known) */
			if (dice.base || (dice.dice && dice.sides) || dice.m_bonus) {
				if (dice.base)
					textblock_append_c(tb, COLOUR_L_GREEN, "%d", dice.base);

				if (dice.dice && dice.sides)
					textblock_append_c(tb, COLOUR_L_GREEN, "%dd%d", dice.dice, dice.sides);

				if (dice.m_bonus)
					textblock_append_c(tb, COLOUR_L_GREEN, "M%d", dice.m_bonus);

				textblock_append(tb, ", ");
			}

			/* Describe hit chances */
			random_chance c;
			hit_chance(&c, chance_of_monster_hit_base(race, race->blow[i].effect),
				player->state.ac + player->state.to_a);
			int percent = random_chance_scaled(c, 100);
			textblock_append_c(tb, COLOUR_L_BLUE, "%d", percent);
			textblock_append(tb, "%%)");

			total_centidamage += (percent * randcalc(dice, 0, AVERAGE));
		}

		described_count++;
	}

	textblock_append(tb, ", averaging");
	if (known_attacks < total_attacks) {
		textblock_append_c(tb, COLOUR_ORANGE, " at least");
	}
	textblock_append_c(tb, COLOUR_L_GREEN, " %d", total_centidamage/100);
	textblock_append(tb, " damage on each of %s turns.  ",
					 lore_pronoun_possessive(msex, false));
}